

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_lite.pb.cc
# Opt level: O2

string * proto2_unittest::V2EnumLite_Name_abi_cxx11_(V2EnumLite value)

{
  int iVar1;
  string *psVar2;
  
  if (V2EnumLite_Name[abi:cxx11](proto2_unittest::V2EnumLite)::kDummy == '\0') {
    iVar1 = __cxa_guard_acquire(&V2EnumLite_Name[abi:cxx11](proto2_unittest::V2EnumLite)::kDummy);
    if (iVar1 != 0) {
      V2EnumLite_Name::kDummy =
           google::protobuf::internal::InitializeEnumStrings
                     ((EnumEntry *)V2EnumLite_entries,(int *)&V2EnumLite_entries_by_number,2,
                      (ExplicitlyConstructed<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_1UL>
                       *)V2EnumLite_strings_abi_cxx11_);
      __cxa_guard_release(&V2EnumLite_Name[abi:cxx11](proto2_unittest::V2EnumLite)::kDummy);
    }
  }
  iVar1 = google::protobuf::internal::LookUpEnumName
                    ((EnumEntry *)V2EnumLite_entries,(int *)&V2EnumLite_entries_by_number,2,value);
  if (iVar1 == -1) {
    google::protobuf::internal::InitProtobufDefaults();
    psVar2 = (string *)&google::protobuf::internal::fixed_address_empty_string;
  }
  else {
    psVar2 = (string *)(V2EnumLite_strings_abi_cxx11_ + (long)iVar1 * 0x20);
  }
  return psVar2;
}

Assistant:

const ::std::string& V2EnumLite_Name(V2EnumLite value) {
  static const bool kDummy = ::google::protobuf::internal::InitializeEnumStrings(
      V2EnumLite_entries, V2EnumLite_entries_by_number, 2,
      V2EnumLite_strings);
  (void)kDummy;

  int idx = ::google::protobuf::internal::LookUpEnumName(V2EnumLite_entries,
                                  V2EnumLite_entries_by_number,
                                  2, value);
  return idx == -1 ? ::google::protobuf::internal::GetEmptyString() : V2EnumLite_strings[idx].get();
}